

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall glcts::anon_unknown_0::Uniform::streamDefinition(Uniform *this,ostringstream *str)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (&str->super_basic_ostream<char,_std::char_traits<char>_>,
                      (this->type).strType._M_dataplus._M_p,(this->type).strType._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->shortName)._M_dataplus._M_p,(this->shortName)._M_string_length);
  UniformType::streamArrayStr(&this->type,str,-1);
  return;
}

Assistant:

void streamDefinition(std::ostringstream& str) const
	{
		str << type.str() << " " << shortName;
		type.streamArrayStr(str);
	}